

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.hpp
# Opt level: O2

ParseFlagMap * csv::internals::make_parse_flags(ParseFlagMap *__return_storage_ptr__,char delimiter)

{
  ParseFlags PVar1;
  int arr_idx;
  long lVar2;
  undefined7 in_register_00000031;
  int iVar3;
  
  iVar3 = 0;
  memset(__return_storage_ptr__,0,0x400);
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    PVar1 = (uint)(iVar3 == -0x76000000) * 3 + NOT_SPECIAL;
    if (iVar3 == -0x73000000) {
      PVar1 = NEWLINE;
    }
    if (iVar3 + -0x80000000 >> 0x18 == (int)CONCAT71(in_register_00000031,delimiter)) {
      PVar1 = DELIMITER;
    }
    __return_storage_ptr__->_M_elems[lVar2] = PVar1;
    iVar3 = iVar3 + 0x1000000;
  }
  return __return_storage_ptr__;
}

Assistant:

HEDLEY_CONST CONSTEXPR_17 ParseFlagMap make_parse_flags(char delimiter) {
            std::array<ParseFlags, 256> ret = {};
            for (int i = -128; i < 128; i++) {
                const int arr_idx = i + 128;
                char ch = char(i);

                if (ch == delimiter)
                    ret[arr_idx] = ParseFlags::DELIMITER;
                else if (ch == '\r' || ch == '\n')
                    ret[arr_idx] = ParseFlags::NEWLINE;
                else
                    ret[arr_idx] = ParseFlags::NOT_SPECIAL;
            }

            return ret;
        }